

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O2

size_t safe_write(int fd,void *buf,size_t len)

{
  size_t in_RAX;
  int *piVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (len < uVar2 || len - uVar2 == 0) {
      return in_RAX;
    }
    while (in_RAX = write(fd,(void *)((long)buf + uVar2),len - uVar2), in_RAX == 0xffffffffffffffff)
    {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        return (size_t)piVar1;
      }
      if (len <= uVar2) {
        return (size_t)piVar1;
      }
    }
    uVar2 = uVar2 + in_RAX;
  } while( true );
}

Assistant:

static size_t safe_write(int fd, const void *buf, size_t len)
{
	size_t ret = 0;
	while(ret < len)
	{
		ssize_t rem;
		if((rem=write(fd, (const char*)buf+ret, len-ret)) == -1)
		{
			if(errno == EINTR)
				continue;
			break;
		}
		ret += rem;
	}
	return ret;
}